

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O2

void SoPlex_getRowVectorReal(void *soplex,int i,int *nnonzeros,long *indices,double *coefs)

{
  ulong uVar1;
  ulong uVar2;
  DSVector row;
  
  ::soplex::DSVectorBase<double>::DSVectorBase(&row,8);
  ::soplex::SoPlexBase<double>::getRowVectorReal((SoPlexBase<double> *)soplex,i,&row);
  *nnonzeros = row.super_SVectorBase<double>.memused;
  uVar2 = 0;
  uVar1 = (ulong)(uint)row.super_SVectorBase<double>.memused;
  if (row.super_SVectorBase<double>.memused < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 8 != uVar2; uVar2 = uVar2 + 8) {
    *(undefined8 *)((long)coefs + uVar2) =
         *(undefined8 *)((long)&(row.super_SVectorBase<double>.m_elem)->val + uVar2 * 2);
    *(long *)((long)indices + uVar2) =
         (long)*(int *)((long)&(row.super_SVectorBase<double>.m_elem)->idx + uVar2 * 2);
  }
  ::soplex::DSVectorBase<double>::~DSVectorBase(&row);
  return;
}

Assistant:

void SoPlex_getRowVectorReal(void* soplex, int i, int* nnonzeros, long* indices, double* coefs)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector row;

   so->getRowVectorReal(i, row);

   *nnonzeros = row.size();

   for(int j = 0; j < *nnonzeros; ++j)
   {
      coefs[j] = row.value(j);
      indices[j] = row.index(j);
   }
}